

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

Result * __thiscall
CoreML::
validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::SupportVectorClassifier>
          (Result *__return_storage_ptr__,CoreML *this,Model *model,
          SupportVectorClassifier *modelParameters,bool allowEmptyLabels,
          bool defaultClassLabelIsInt64)

{
  int iVar1;
  bool bVar2;
  Int64Vector *pIVar3;
  StringVector *pSVar4;
  char cVar5;
  byte unaff_BPL;
  Result *this_00;
  ModelDescription *interface;
  allocator local_49;
  Result result;
  
  cVar5 = (char)modelParameters;
  iVar1 = model[3].specificationversion_;
  if (iVar1 == 0) {
    if (cVar5 == '\0') {
      std::__cxx11::string::string
                ((string *)&result,"Classifier models must provide class labels.",&local_49);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
LAB_0056fc96:
      this_00 = &result;
      goto LAB_0056fc9b;
    }
  }
  else if (iVar1 == 100) {
    if (cVar5 == '\0') {
      pSVar4 = Specification::SupportVectorClassifier::stringclasslabels
                         ((SupportVectorClassifier *)model);
      if ((pSVar4->vector_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        std::__cxx11::string::string
                  ((string *)&result,
                   "Classifier declared to have String class labels must provide labels.",&local_49)
        ;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
        goto LAB_0056fc96;
      }
    }
    pIVar3 = Specification::SupportVectorClassifier::int64classlabels
                       ((SupportVectorClassifier *)model);
    if ((pIVar3->vector_).current_size_ != 0) {
      std::__cxx11::string::string
                ((string *)&result,
                 "Classifier declared with String class labels must provide exclusively String class labels."
                 ,&local_49);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
      goto LAB_0056fc96;
    }
    allowEmptyLabels = false;
  }
  else {
    allowEmptyLabels = (bool)unaff_BPL;
    if (iVar1 == 0x65) {
      if (cVar5 == '\0') {
        pIVar3 = Specification::SupportVectorClassifier::int64classlabels
                           ((SupportVectorClassifier *)model);
        if ((pIVar3->vector_).current_size_ == 0) {
          std::__cxx11::string::string
                    ((string *)&result,
                     "Classifier declared to have Int64 class labels must provide labels.",&local_49
                    );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
          goto LAB_0056fc96;
        }
      }
      pSVar4 = Specification::SupportVectorClassifier::stringclasslabels
                         ((SupportVectorClassifier *)model);
      if ((pSVar4->vector_).super_RepeatedPtrFieldBase.current_size_ != 0) {
        std::__cxx11::string::string
                  ((string *)&result,
                   "Classifier declared with Int64 class labels must provide exclusively Int64 class labels."
                   ,&local_49);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
        goto LAB_0056fc96;
      }
      allowEmptyLabels = true;
    }
  }
  interface = *(ModelDescription **)(this + 0x10);
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateFeatureDescriptions(&result,interface,*(int *)(this + 0x18));
  bVar2 = Result::good(&result);
  if (bVar2) {
    validateClassifierFeatureDescriptions
              (__return_storage_ptr__,interface,(bool)(allowEmptyLabels & 1));
  }
  else {
    Result::Result(__return_storage_ptr__,&result);
  }
  this_00 = (Result *)&result.m_message;
LAB_0056fc9b:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result validateClassifierInterface(const T& model,
                                       const U& modelParameters,
                                       const bool allowEmptyLabels = false,
                                       const bool defaultClassLabelIsInt64 = false) {
        
        bool expected_class_is_int64;
        
        // validate class labels
        switch (modelParameters.ClassLabels_case()) {
            case U::kInt64ClassLabels:
                if (!allowEmptyLabels && modelParameters.int64classlabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have Int64 class labels must provide labels.");
                }
                
                if(modelParameters.stringclasslabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared with Int64 class labels must provide exclusively Int64 class labels.");
                }
                
                expected_class_is_int64 = true;
                
                break;
                
            case U::kStringClassLabels:
                if (!allowEmptyLabels && modelParameters.stringclasslabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have String class labels must provide labels.");
                }
                
                if(modelParameters.int64classlabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                    "Classifier declared with String class labels must provide exclusively String class labels.");
                }
                
                expected_class_is_int64 = false;
                
                break;
                
            case U::CLASSLABELS_NOT_SET:
                if (!allowEmptyLabels) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Classifier models must provide class labels.");
                }
                expected_class_is_int64 = defaultClassLabelIsInt64;
                break;
        }
        const Specification::ModelDescription& interface = model.description();
        
            // Validate feature descriptions
        Result result = validateFeatureDescriptions(interface, model.specificationversion());
        if (!result.good()) {
            return result;
        }

        return validateClassifierFeatureDescriptions(interface, expected_class_is_int64);
    }